

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::GetKeyMagnitude2d
                 (ImGuiKey key_left,ImGuiKey key_right,ImGuiKey key_up,ImGuiKey key_down)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  ImGuiContext *ctx;
  ImGuiKeyData *pIVar5;
  ImGuiContext *g;
  
  ctx = GImGui;
  pIVar5 = GetKeyData(GImGui,key_right);
  fVar1 = pIVar5->AnalogValue;
  pIVar5 = GetKeyData(ctx,key_left);
  fVar2 = pIVar5->AnalogValue;
  pIVar5 = GetKeyData(ctx,key_down);
  fVar3 = pIVar5->AnalogValue;
  pIVar5 = GetKeyData(ctx,key_up);
  IVar4.y = fVar3 - pIVar5->AnalogValue;
  IVar4.x = fVar1 - fVar2;
  return IVar4;
}

Assistant:

ImVec2 ImGui::GetKeyMagnitude2d(ImGuiKey key_left, ImGuiKey key_right, ImGuiKey key_up, ImGuiKey key_down)
{
    return ImVec2(
        GetKeyData(key_right)->AnalogValue - GetKeyData(key_left)->AnalogValue,
        GetKeyData(key_down)->AnalogValue - GetKeyData(key_up)->AnalogValue);
}